

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_engine_base.cpp
# Opt level: O0

int __thiscall zmq::stream_engine_base_t::decode_and_push(stream_engine_base_t *this,msg_t *msg_)

{
  _func_int **pp_Var1;
  byte bVar2;
  int iVar3;
  int *piVar4;
  msg_t *in_RSI;
  io_object_t *in_RDI;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int local_4;
  
  if (in_RDI[0x54].super_i_poll_events._vptr_i_poll_events == (_func_int **)0x0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_mechanism != NULL",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream_engine_base.cpp"
            ,0x27b);
    fflush(_stderr);
    zmq_abort((char *)0x23af37);
  }
  pp_Var1 = in_RDI[0x54].super_i_poll_events._vptr_i_poll_events;
  iVar3 = (**(code **)(*pp_Var1 + 0x28))(pp_Var1,in_RSI);
  if (iVar3 == -1) {
    local_4 = -1;
  }
  else {
    if (((ulong)in_RDI[0x5c].super_i_poll_events._vptr_i_poll_events & 0x10000) != 0) {
      *(undefined1 *)((long)&in_RDI[0x5c].super_i_poll_events._vptr_i_poll_events + 2) = 0;
      io_object_t::cancel_timer(in_RDI,in_stack_ffffffffffffffdc);
    }
    if (((ulong)in_RDI[0x5c].super_i_poll_events._vptr_i_poll_events & 0x100) != 0) {
      *(undefined1 *)((long)&in_RDI[0x5c].super_i_poll_events._vptr_i_poll_events + 1) = 0;
      io_object_t::cancel_timer(in_RDI,in_stack_ffffffffffffffdc);
    }
    bVar2 = msg_t::flags(in_RSI);
    if ((bVar2 & 2) != 0) {
      (*(in_RDI->super_i_poll_events)._vptr_i_poll_events[0x10])(in_RDI,in_RSI);
    }
    if (in_RDI[0x56]._poller != (poller_t *)0x0) {
      msg_t::set_metadata((msg_t *)in_RDI,
                          (metadata_t *)
                          CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    }
    iVar3 = (*((in_RDI[100]._poller)->super_worker_poller_base_t).super_poller_base_t.
              _vptr_poller_base_t[0x1d])(in_RDI[100]._poller,in_RSI);
    if (iVar3 == -1) {
      piVar4 = __errno_location();
      if (*piVar4 == 0xb) {
        in_RDI[0x55]._poller = (poller_t *)push_one_then_decode_and_push;
        in_RDI[0x56].super_i_poll_events._vptr_i_poll_events = (_func_int **)0x0;
      }
      local_4 = -1;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int zmq::stream_engine_base_t::decode_and_push (msg_t *msg_)
{
    zmq_assert (_mechanism != NULL);

    if (_mechanism->decode (msg_) == -1)
        return -1;

    if (_has_timeout_timer) {
        _has_timeout_timer = false;
        cancel_timer (heartbeat_timeout_timer_id);
    }

    if (_has_ttl_timer) {
        _has_ttl_timer = false;
        cancel_timer (heartbeat_ttl_timer_id);
    }

    if (msg_->flags () & msg_t::command) {
        process_command_message (msg_);
    }

    if (_metadata)
        msg_->set_metadata (_metadata);
    if (_session->push_msg (msg_) == -1) {
        if (errno == EAGAIN)
            _process_msg = &stream_engine_base_t::push_one_then_decode_and_push;
        return -1;
    }
    return 0;
}